

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O2

int_fast16_t flexfloat_exp(flexfloat_t *a)

{
  ulong uVar1;
  
  uVar1 = (ulong)a->value >> 0x34 & 0x7ff;
  if ((uVar1 != 0) && ((int)uVar1 != 0x7ff)) {
    uVar1 = (uVar1 + ~(-1L << ((a->desc).exp_bits - 1 & 0x3f))) - 0x3ff;
  }
  return uVar1;
}

Assistant:

int_fast16_t flexfloat_exp(const flexfloat_t *a)
{
    int_fast16_t a_exp   = EXPONENT(CAST_TO_INT(a->value));

    int_fast16_t bias    = flexfloat_bias(a->desc);

    if(a_exp == 0 || a_exp == INF_EXP)
        return a_exp;
    else
        return (a_exp - BIAS) + bias;
}